

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::Error(char *m1,char *m2,char *m3,char *m4)

{
  string message;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMake Error: ","");
  if (m1 != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_48);
  }
  if (m2 != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_48);
  }
  if (m3 != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_48);
  }
  if (m4 != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_48);
  }
  s_ErrorOccured = true;
  Message(&local_48,"Error");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSystemTools::Error(const char* m1, const char* m2, const char* m3,
                          const char* m4)
{
  std::string message = "CMake Error: ";
  if (m1) {
    message += m1;
  }
  if (m2) {
    message += m2;
  }
  if (m3) {
    message += m3;
  }
  if (m4) {
    message += m4;
  }
  cmSystemTools::s_ErrorOccured = true;
  cmSystemTools::Message(message, "Error");
}